

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

int req0_sock_set_resend_tick(void *arg,void *buf,size_t sz,nni_opt_type t)

{
  int iVar1;
  nni_duration local_34;
  int rv;
  nng_duration tick;
  req0_sock *s;
  size_t sStack_20;
  nni_opt_type t_local;
  size_t sz_local;
  void *buf_local;
  void *arg_local;
  
  _rv = arg;
  s._4_4_ = t;
  sStack_20 = sz;
  sz_local = (size_t)buf;
  buf_local = arg;
  iVar1 = nni_copyin_ms(&local_34,buf,sz,t);
  if (iVar1 == 0) {
    nni_mtx_lock((nni_mtx *)((long)_rv + 0x358));
    *(nni_duration *)((long)_rv + 0x350) = local_34;
    nni_mtx_unlock((nni_mtx *)((long)_rv + 0x358));
  }
  return iVar1;
}

Assistant:

static int
req0_sock_set_resend_tick(
    void *arg, const void *buf, size_t sz, nni_opt_type t)
{
	req0_sock   *s = arg;
	nng_duration tick;
	int          rv;

	if ((rv = nni_copyin_ms(&tick, buf, sz, t)) == 0) {
		nni_mtx_lock(&s->mtx);
		s->retry_tick = tick;
		nni_mtx_unlock(&s->mtx);
	}
	return (rv);
}